

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall mocker::RenameASTIdentifiers::operator()(RenameASTIdentifiers *this,NewExpr *node)

{
  bool bVar1;
  shared_ptr<mocker::ast::ASTNode> local_48;
  reference local_38;
  shared_ptr<mocker::ast::Expression> *exp;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
  *__range2;
  NewExpr *node_local;
  RenameASTIdentifiers *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
           ::begin(&node->providedDims);
  exp = (shared_ptr<mocker::ast::Expression> *)
        std::
        vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
        ::end(&node->providedDims);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<mocker::ast::Expression>_*,_std::vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>_>
                                *)&exp);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<mocker::ast::Expression>_*,_std::vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>_>
               ::operator*(&__end2);
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (&local_48,local_38);
    visit(this,&local_48);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_48);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::Expression>_*,_std::vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void operator()(ast::NewExpr &node) const override {
    for (auto &exp : node.providedDims)
      visit(exp);
  }